

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

Image * GenImagePerlinNoise(Image *__return_storage_ptr__,int width,int height,int offsetX,
                           int offsetY,float scale)

{
  undefined1 uVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int x;
  ulong uVar6;
  long lVar7;
  float y;
  float fVar8;
  float fVar9;
  float fVar10;
  
  pvVar2 = malloc((long)(height * width) << 2);
  fVar10 = (float)width / (float)height;
  uVar5 = 0;
  if (0 < width) {
    uVar5 = (ulong)(uint)width;
  }
  uVar4 = 0;
  if (0 < height) {
    uVar4 = (ulong)(uint)height;
  }
  lVar7 = (long)pvVar2 + 3;
  for (uVar3 = 0; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    y = (float)(offsetY + (int)uVar3) * (scale / (float)height);
    if (width <= height) {
      y = y / fVar10;
    }
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      fVar8 = (float)(offsetX + (int)uVar6) * (scale / (float)width);
      if (height < width) {
        fVar8 = fVar8 * fVar10;
      }
      fVar9 = stb_perlin_fbm_noise3(fVar8,y,1.0,2.0,0.5,6);
      fVar8 = -1.0;
      if (-1.0 <= fVar9) {
        fVar8 = fVar9;
      }
      fVar9 = 1.0;
      if (fVar8 <= 1.0) {
        fVar9 = fVar8;
      }
      uVar1 = (undefined1)(int)((fVar9 + 1.0) * 0.5 * 255.0);
      *(undefined1 *)(lVar7 + -3 + uVar6 * 4) = uVar1;
      *(undefined1 *)(lVar7 + -2 + uVar6 * 4) = uVar1;
      *(undefined1 *)(lVar7 + -1 + uVar6 * 4) = uVar1;
      *(undefined1 *)(lVar7 + uVar6 * 4) = 0xff;
    }
    lVar7 = lVar7 + (long)width * 4;
  }
  __return_storage_ptr__->data = pvVar2;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImagePerlinNoise(int width, int height, int offsetX, int offsetY, float scale)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    float aspectRatio = (float)width / (float)height;
    for (int y = 0; y < height; y++)
    {
        for (int x = 0; x < width; x++)
        {
            float nx = (float)(x + offsetX)*(scale/(float)width);
            float ny = (float)(y + offsetY)*(scale/(float)height);

            // Apply aspect ratio compensation to wider side
            if (width > height) nx *= aspectRatio;
            else ny /= aspectRatio;

            // Basic perlin noise implementation (not used)
            //float p = (stb_perlin_noise3(nx, ny, 0.0f, 0, 0, 0);

            // Calculate a better perlin noise using fbm (fractal brownian motion)
            // Typical values to start playing with:
            //   lacunarity = ~2.0   -- spacing between successive octaves (use exactly 2.0 for wrapping output)
            //   gain       =  0.5   -- relative weighting applied to each successive octave
            //   octaves    =  6     -- number of "octaves" of noise3() to sum
            float p = stb_perlin_fbm_noise3(nx, ny, 1.0f, 2.0f, 0.5f, 6);

            // Clamp between -1.0f and 1.0f
            if (p < -1.0f) p = -1.0f;
            if (p > 1.0f) p = 1.0f;

            // We need to normalize the data from [-1..1] to [0..1]
            float np = (p + 1.0f)/2.0f;

            int intensity = (int)(np*255.0f);
            pixels[y*width + x] = (Color){ intensity, intensity, intensity, 255 };
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}